

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
insert<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,size_t pos,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_t __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  ulong uVar7;
  char *__s1;
  undefined8 *in_R9;
  Maybe<unsigned_long> MVar8;
  Iterator iter;
  Iterator IStack_78;
  size_t local_60;
  size_t local_58;
  SearchKey local_50;
  StringPtr *local_48;
  size_t *local_40;
  
  local_60 = table.size_;
  local_48 = table.ptr;
  local_40 = &local_60;
  local_50._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00225340;
  local_58 = pos;
  _::BTreeImpl::insert(&IStack_78,(BTreeImpl *)&(local_48->content).size_,&local_50);
  uVar4 = (ulong)IStack_78.row;
  if (uVar4 == 0xe) {
    uVar4 = 0xe;
  }
  else {
    uVar1 = (IStack_78.leaf)->rows[uVar4].i;
    if (uVar1 != 0) {
      uVar7 = (ulong)(uVar1 - 1);
      lVar5 = uVar7 * 0x20;
      lVar2 = *(long *)(local_60 + 8 + lVar5);
      __n = lVar2 + (ulong)(lVar2 == 0);
      if (__n == in_R9[1]) {
        if (lVar2 == 0) {
          __s1 = "";
        }
        else {
          __s1 = *(char **)(local_60 + lVar5);
        }
        iVar3 = bcmp(__s1,(void *)*in_R9,__n);
        if (iVar3 == 0) {
          *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar7;
          aVar6 = extraout_RDX;
          goto LAB_00176ffb;
        }
      }
    }
  }
  memmove((IStack_78.leaf)->rows + uVar4 + 1,(IStack_78.leaf)->rows + uVar4,
          (ulong)(IStack_78.row + 1) * -4 + 0x38);
  ((IStack_78.leaf)->rows + uVar4 + 1)[-1] = (MaybeUint)((int)params + 1);
  *this = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x0;
  aVar6 = extraout_RDX_00;
LAB_00176ffb:
  MVar8.ptr.field_1.value = aVar6.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }